

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O2

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  StringPool *this_00;
  TopLevelASBase<Diligent::EngineVkImplTraits> *pTVar1;
  HIT_GROUP_BINDING_MODE BindingMode_00;
  size_t sVar2;
  IMemoryAllocator *Allocator;
  BottomLevelASVkImpl *pObj;
  int iVar3;
  undefined4 in_register_0000000c;
  char (*Args_1) [38];
  char (*Args_1_00) [43];
  size_t sVar4;
  char *str;
  undefined3 in_register_00000089;
  ulong uVar5;
  long lVar6;
  char (*pacVar7) [43];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>,_bool>
  pVar8;
  Uint32 InstanceOffset;
  TopLevelASBase<Diligent::EngineVkImplTraits> *local_78;
  Uint32 local_70;
  HIT_GROUP_BINDING_MODE local_6c [4];
  string msg;
  char *NameCopy;
  
  local_6c._1_3_ = in_register_00000089;
  local_6c[0] = BindingMode;
  Args_1 = (char (*) [38])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex);
  local_78 = this;
  local_70 = BaseContributionToHitGroupIndex;
  ClearInstanceData(this);
  sVar4 = 0;
  for (lVar6 = 0; pTVar1 = local_78, (ulong)InstanceCount * 0x50 - lVar6 != 0; lVar6 = lVar6 + 0x50)
  {
    str = *(char **)((long)((pInstances->Transform).data + -1) + lVar6);
    if (str == (char *)0x0) {
      FormatString<char[26],char[38]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"pInstances[i].InstanceName != nullptr",Args_1);
      Args_1 = (char (*) [38])0x72;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetInstanceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x72);
      std::__cxx11::string::~string((string *)&msg);
      str = *(char **)((long)((pInstances->Transform).data + -1) + lVar6);
    }
    sVar2 = StringPool::GetRequiredReserveSize(str);
    sVar4 = sVar4 + sVar2;
  }
  Allocator = GetRawAllocator();
  this_00 = &pTVar1->m_StringPool;
  StringPool::Reserve(this_00,sVar4,Allocator);
  Args_1_00 = (char (*) [43])&InstanceOffset;
  InstanceOffset = local_70;
  BindingMode_00 = local_6c[0];
  pacVar7 = (char (*) [43])(ulong)local_6c[0];
  for (uVar5 = 0; InstanceCount != uVar5; uVar5 = uVar5 + 1) {
    NameCopy = StringPool::CopyString(this_00,pInstances->InstanceName);
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity._0_4_ = 0;
    pObj = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(pInstances->pBLAS);
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&msg._M_string_length,pObj);
    msg._M_dataplus._M_p._4_4_ = (int)uVar5;
    msg._M_dataplus._M_p._0_4_ = pInstances->ContributionToHitGroupIndex;
    Args_1_00 = pacVar7;
    CalculateHitGroupIndex((InstanceDesc *)&msg,&InstanceOffset,HitGroupStride,BindingMode_00);
    msg.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(msg._M_string_length + 0xc0);
    pVar8 = std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<char_const*&,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc&>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&pTVar1->m_Instances,&NameCopy,&msg);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      Args_1_00 = (char (*) [43])0x8a;
      LogError<true,char[30]>
                (false,"SetInstanceData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                 ,0x8a,(char (*) [30])"Instance name must be unique!");
    }
    RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release
              ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&msg._M_string_length);
    pInstances = pInstances + 1;
  }
  sVar4 = StringPool::GetRemainingSize(this_00);
  pTVar1 = local_78;
  if (sVar4 != 0) {
    FormatString<char[26],char[43]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_StringPool.GetRemainingSize() == 0",Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetInstanceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x8d);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar3 = -1;
  if (local_6c[0] == HIT_GROUP_BINDING_MODE_PER_TLAS) {
    iVar3 = HitGroupStride - 1;
  }
  (pTVar1->m_BuildInfo).HitGroupStride = HitGroupStride;
  (pTVar1->m_BuildInfo).FirstContributionToHitGroupIndex = local_70;
  (pTVar1->m_BuildInfo).LastContributionToHitGroupIndex = iVar3 + InstanceOffset;
  (pTVar1->m_BuildInfo).BindingMode = local_6c[0];
  (pTVar1->m_BuildInfo).InstanceCount = InstanceCount;
  LOCK();
  (pTVar1->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
       (pTVar1->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return true;
}

Assistant:

bool SetInstanceData(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        try
        {
            ClearInstanceData();

            size_t StringPoolSize = 0;
            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                VERIFY_EXPR(pInstances[i].InstanceName != nullptr);
                StringPoolSize += StringPool::GetRequiredReserveSize(pInstances[i].InstanceName);
            }

            this->m_StringPool.Reserve(StringPoolSize, GetRawAllocator());

            Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                const auto&  Inst     = pInstances[i];
                const char*  NameCopy = this->m_StringPool.CopyString(Inst.InstanceName);
                InstanceDesc Desc     = {};

                Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
                Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
                Desc.InstanceIndex               = i;
                CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
                Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
                bool IsUniqueName = this->m_Instances.emplace(NameCopy, Desc).second;
                if (!IsUniqueName)
                    LOG_ERROR_AND_THROW("Instance name must be unique!");
            }

            VERIFY_EXPR(this->m_StringPool.GetRemainingSize() == 0);

            InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

            this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
            this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
            this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
            this->m_BuildInfo.BindingMode                      = BindingMode;
            this->m_BuildInfo.InstanceCount                    = InstanceCount;

#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            return true;
        }
        catch (...)
        {
#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            ClearInstanceData();
            return false;
        }
    }